

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

void jacobi(float (*aa) [2],int n,float *d,float (*v) [2],int *nrot)

{
  int iVar1;
  long lVar2;
  float *pfVar3;
  uint uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float afVar10 [2];
  float z [2];
  float b [2];
  float a [2] [2];
  
  if (n != 2) {
    fprintf(_stderr,"\nFatal error: n %d not N %d in jacobi\n",(ulong)(uint)n,2);
    exit(1);
  }
  lVar2 = 0;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    v[lVar5] = (float  [2])0x0;
    a[lVar5] = aa[lVar5];
    *(undefined4 *)((long)*v + lVar2) = 0x3f800000;
    lVar2 = lVar2 + 0xc;
  }
  pfVar3 = a[0];
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar9 = *pfVar3;
    d[lVar2] = fVar9;
    z[lVar2] = 0.0;
    b[lVar2] = fVar9;
    pfVar3 = pfVar3 + 3;
  }
  *nrot = 0;
  iVar1 = 0;
  uVar4 = 0;
  do {
    if ((uVar4 == 100) || ((a[0][1] == 0.0 && (!NAN(a[0][1]))))) {
      return;
    }
    fVar6 = ABS(a[0][1]);
    fVar9 = fVar6 * 0.2 * 0.25;
    if (2 < uVar4) {
      fVar9 = 0.0;
    }
    fVar7 = fVar6 * 100.0;
    if (uVar4 < 4) {
LAB_00103fa2:
      if (fVar9 < fVar6) {
        fVar9 = d[1] - *d;
        fVar6 = ABS(fVar9);
        if ((fVar7 + fVar6 != fVar6) || (NAN(fVar7 + fVar6) || NAN(fVar6))) {
          fVar6 = (fVar9 * 0.5) / a[0][1];
          fVar9 = 1.0 / (SQRT(fVar6 * fVar6 + 1.0) + ABS(fVar6));
          if (fVar6 < 0.0) {
            fVar9 = -fVar9;
          }
        }
        else {
          fVar9 = a[0][1] / fVar9;
        }
        fVar6 = 1.0 / SQRT(fVar9 * fVar9 + 1.0);
        fVar7 = a[0][1] * fVar9;
        fVar9 = fVar9 * fVar6;
        fVar6 = fVar9 / (fVar6 + 1.0);
        z[0] = z[0] - fVar7;
        z[1] = z[1] + fVar7;
        *d = *d - fVar7;
        d[1] = fVar7 + d[1];
        for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
          fVar7 = SUB84(v[lVar2],0);
          fVar8 = SUB84(v[lVar2],4);
          afVar10[0] = (fVar7 * fVar6 + fVar8) * -fVar9 + fVar7;
          afVar10[1] = (-fVar8 * fVar6 + fVar7) * fVar9 + fVar8;
          v[lVar2] = afVar10;
        }
        iVar1 = iVar1 + 1;
        *nrot = iVar1;
        goto LAB_00104109;
      }
    }
    else {
      fVar8 = ABS(*d);
      if ((fVar7 + fVar8 != fVar8) || (NAN(fVar7 + fVar8) || NAN(fVar8))) goto LAB_00103fa2;
      fVar8 = ABS(d[1]);
      if ((fVar7 + fVar8 != fVar8) || (NAN(fVar7 + fVar8) || NAN(fVar8))) goto LAB_00103fa2;
LAB_00104109:
      a[0][1] = 0.0;
    }
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      fVar9 = b[lVar2];
      b[lVar2] = z[lVar2] + fVar9;
      d[lVar2] = z[lVar2] + fVar9;
      z[lVar2] = 0.0;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void jacobi(float aa[N][N], int n, float d[N], float v[N][N],
int *nrot)
{
int j,iq,ip,i;
float thresh,theta,tau,t,sm,s,h,g,c;
float b[N],z[N],a[N][N];

if(n!=N) {
    fprintf(stderr,"\nFatal error: n %d not N %d in jacobi\n",n,N);
    exit(EXIT_FAILURE);
    }
for(ip=0;ip<n;ip++) /* Initialize to the identity matrix */
	{
	for(iq=0;iq<n;iq++) v[ip][iq] = 0.0;
	for(iq=0;iq<n;iq++) a[ip][iq] = aa[ip][iq]; /* Don't destroy aa */
	v[ip][ip] = 1.0;
	}
/* Initialize b and d to the diagonals of a */
for(ip=0;ip<n;ip++)
	{
	b[ip] = d[ip] = a[ip][ip];
	z[ip] = 0.0;
	}
*nrot = 0;
for(i=0;i<100;i++)
	{
	sm = 0.0;
	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			sm += (float) fabs(a[ip][iq]);
		}

	/* Normal return, which relies on quadratic convergence to
	   machine underflow */
	if(sm == 0.0) return;

	if(i<3) thresh=(float) (0.2*sm/(n*n)); /* on the first three sweeps */
	else thresh = 0.0; /* the rest of the sweeps */

	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			{
			g = (float)(100.0*fabs(a[ip][iq]));
			/* After 4 sweeps skip the rotation if the
			   off diagonal element is small */
			if(i>3 && fabs(d[ip])+g == fabs(d[ip])
			       && fabs(d[iq])+g == fabs(d[iq])) a[ip][iq] = 0.0;
			else if(fabs(a[ip][iq]) > thresh)
				{
				h = d[iq]-d[ip];
				if(fabs(h)+g==fabs(h)) t=(a[ip][iq])/h;
				else
				  {
				  theta = 0.5f*h/(a[ip][iq]);
				  t = (float)(1.0/(fabs(theta)+sqrt(1.0+theta*theta)));
				  if(theta < 0.0) t = -t;
				  }
				c = (float)(1.0/sqrt(1.0+t*t));
				s = t*c;
				tau = s/(1.0f+c);
				h = t*a[ip][iq];
				z[ip] -= h;
				z[iq] += h;
				d[ip] -= h;
				d[iq] += h;
				a[ip][iq] = 0.0;
				for(j=0;j<ip-1;j++)
					rotate(a,j,ip,j,iq,&h,&g,s,tau);
				for(j=ip+1;j<iq-1;j++)
					rotate(a,ip,j,j,iq,&h,&g,s,tau);
				for(j=iq+1;j<n;j++)
					rotate(a,ip,j,iq,j,&h,&g,s,tau);
				for(j=0;j<n;j++)
					rotate(v,j,ip,j,iq,&h,&g,s,tau);
				++(*nrot);
				}
			}
		}
	for(ip=0;ip<n;ip++)
		{
		b[ip] += z[ip];
		d[ip] = b[ip];
		z[ip] = 0.0;
		}
	}
/* fprintf(stderr,"\nFatal error: too many iterations in jacobi\n"); */
}